

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationRootElements::getFirstSecTerForPrimary(CollationRootElements *this,int32_t index)

{
  uint32_t secTer;
  int32_t index_local;
  CollationRootElements *this_local;
  
  if ((this->elements[index] & 0x80) == 0) {
    this_local._4_4_ = 0x5000500;
  }
  else {
    this_local._4_4_ = this->elements[index] & 0xffffff7f;
    if (0x5000500 < this_local._4_4_) {
      this_local._4_4_ = 0x5000500;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationRootElements::getFirstSecTerForPrimary(int32_t index) const {
    uint32_t secTer = elements[index];
    if((secTer & SEC_TER_DELTA_FLAG) == 0) {
        // No sec/ter delta.
        return Collation::COMMON_SEC_AND_TER_CE;
    }
    secTer &= ~SEC_TER_DELTA_FLAG;
    if(secTer > Collation::COMMON_SEC_AND_TER_CE) {
        // Implied sec/ter.
        return Collation::COMMON_SEC_AND_TER_CE;
    }
    // Explicit sec/ter below common/common.
    return secTer;
}